

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool duckdb_snappy::Uncompress(char *compressed,size_t compressed_length,string *uncompressed)

{
  bool bVar1;
  ulong in_RAX;
  pointer uncompressed_00;
  size_t ulength;
  ulong local_28;
  
  local_28 = in_RAX;
  bVar1 = GetUncompressedLength(compressed,compressed_length,&local_28);
  if ((bVar1) && (local_28 >> 0x3e == 0)) {
    uncompressed_00 = (char *)0x0;
    std::__cxx11::string::resize((ulong)uncompressed,(char)local_28);
    if (uncompressed->_M_string_length != 0) {
      uncompressed_00 = (uncompressed->_M_dataplus)._M_p;
    }
    bVar1 = RawUncompress(compressed,compressed_length,uncompressed_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool Uncompress(const char* compressed, size_t compressed_length,
                std::string* uncompressed) {
  size_t ulength;
  if (!GetUncompressedLength(compressed, compressed_length, &ulength)) {
    return false;
  }
  // On 32-bit builds: max_size() < kuint32max.  Check for that instead
  // of crashing (e.g., consider externally specified compressed data).
  if (ulength > uncompressed->max_size()) {
    return false;
  }
  STLStringResizeUninitialized(uncompressed, ulength);
  return RawUncompress(compressed, compressed_length,
                       string_as_array(uncompressed));
}